

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrics.c
# Opt level: O0

unsigned_long vm_swap_free(void)

{
  char *pcVar1;
  sensor_slurp proc_meminfo;
  char *p;
  unsigned_long val;
  undefined1 auStack_2018 [8];
  char *in_stack_ffffffffffffdff0;
  ulong local_8;
  
  memcpy(auStack_2018,&PTR_anon_var_dwarf_2acda_00196b18,0x2008);
  pcVar1 = update_file((sensor_slurp *)0x15116f);
  pcVar1 = strstr(pcVar1,"SwapFree:");
  if (pcVar1 == (char *)0x0) {
    local_8 = 0;
  }
  else {
    pcVar1 = skip_token(in_stack_ffffffffffffdff0);
    local_8 = strtoul(pcVar1,(char **)0x0,10);
  }
  return local_8;
}

Assistant:

unsigned long vm_swap_free ( void )
{
  unsigned long val = 0;
#ifdef HAVE_MAC_SYSCTL
  static int mib[2] = {CTL_VM, VM_SWAPUSAGE};
  struct xsw_usage swapval;
  size_t vlen;
  vlen = sizeof(struct xsw_usage);
  sysctl(mib,2,&swapval,&vlen,NULL,0);
  val = (unsigned long) swapval.xsu_avail;
  
#else
    char *p;
   
      sensor_slurp proc_meminfo = { "/proc/meminfo" };
    p = strstr( update_file(&proc_meminfo), "SwapFree:" );
    if(p) {
	p = skip_token(p);
	val = strtoul( p, NULL, 10 ); 
    } else {
	val = 0;
    }
#endif //end HAVE_MAC_SYSCTL
    return val;
}